

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  bool bVar2;
  bool reduceMemory;
  bool reduceTime;
  bool useStream;
  bool enableCoreCheck;
  int iVar3;
  uint uVar4;
  ostream *poVar5;
  uint uVar6;
  char *pcVar7;
  byte bVar8;
  ulong uVar9;
  
  if (argc < 2) {
    usageMessage((ostream *)&std::cerr,*argv,false);
    uVar4 = 1;
  }
  else {
    reduceTime = false;
    enableCoreCheck = false;
    bVar8 = 0;
    useStream = false;
    reduceMemory = false;
    for (uVar9 = 1; (uint)argc != uVar9; uVar9 = uVar9 + 1) {
      pcVar7 = argv[uVar9];
      cVar1 = *pcVar7;
      if ((((cVar1 == '-') && (pcVar7[1] == 'h')) && (pcVar7[2] == '\0')) ||
         (iVar3 = strcmp(pcVar7,"--help"), iVar3 == 0)) {
        usageMessage((ostream *)&std::cout,"exrcheck",true);
        break;
      }
      if (cVar1 == '-') {
        if ((pcVar7[1] == 'm') && (pcVar7[2] == '\0')) {
          reduceMemory = true;
        }
        else if ((pcVar7[1] == 't') && (pcVar7[2] == '\0')) {
          reduceTime = true;
        }
        else if ((pcVar7[1] == 's') && (pcVar7[2] == '\0')) {
          useStream = true;
        }
        else {
          if ((pcVar7[1] != 'c') || (pcVar7[2] != '\0')) goto LAB_001025f9;
          enableCoreCheck = true;
        }
      }
      else {
LAB_001025f9:
        iVar3 = strcmp(pcVar7,"--version");
        if (iVar3 == 0) {
          pcVar7 = (char *)Imf_3_4::getLibraryVersion();
          poVar5 = std::operator<<((ostream *)&std::cout,"exrcheck (OpenEXR) ");
          std::operator<<(poVar5,"3.4.0");
          iVar3 = strcmp(pcVar7,"3.4.0");
          if (iVar3 != 0) {
            poVar5 = std::operator<<((ostream *)&std::cout,"(OpenEXR version ");
            poVar5 = std::operator<<(poVar5,pcVar7);
            std::operator<<(poVar5,")");
          }
          poVar5 = std::operator<<((ostream *)&std::cout," https://openexr.com");
          std::endl<char,std::char_traits<char>>(poVar5);
          poVar5 = std::operator<<((ostream *)&std::cout,
                                   "Copyright (c) Contributors to the OpenEXR Project");
          std::endl<char,std::char_traits<char>>(poVar5);
          poVar5 = std::operator<<((ostream *)&std::cout,"License BSD-3-Clause");
          std::endl<char,std::char_traits<char>>(poVar5);
          break;
        }
        iVar3 = access(pcVar7,4);
        if (iVar3 != 0) {
          poVar5 = std::operator<<((ostream *)&std::cerr,"No such file: ");
          poVar5 = std::operator<<(poVar5,argv[uVar9]);
          std::endl<char,std::char_traits<char>>(poVar5);
          uVar6 = 0xffffffff;
          goto LAB_0010279b;
        }
        poVar5 = std::operator<<((ostream *)&std::cout," file ");
        poVar5 = std::operator<<(poVar5,argv[uVar9]);
        std::operator<<(poVar5,' ');
        std::ostream::flush();
        bVar2 = exrCheck(argv[uVar9],reduceMemory,reduceTime,useStream,enableCoreCheck);
        pcVar7 = "OK\n";
        if (bVar2) {
          pcVar7 = "bad\n";
          bVar8 = 1;
        }
        std::operator<<((ostream *)&std::cout,pcVar7);
      }
    }
    uVar6 = 0;
LAB_0010279b:
    uVar4 = (uint)bVar8;
    if (uVar9 < (uint)argc) {
      uVar4 = uVar6;
    }
  }
  return uVar4;
}

Assistant:

int
main (int argc, char** argv)
{
    if (argc < 2)
    {
        usageMessage (cerr, argv[0], false);
        return 1;
    }

    bool reduceMemory    = false;
    bool reduceTime      = false;
    bool enableCoreCheck = false;
    bool badFileFound    = false;
    bool useStream       = false;
    for (int i = 1; i < argc; ++i)
    {
        if (!strcmp (argv[i], "-h") || !strcmp (argv[i], "--help"))
        {
            usageMessage (cout, "exrcheck", true);
            return 0;
        }
        else if (!strcmp (argv[i], "-m"))
        {
            //
            // note for further memory reduction, calls to the following could be added here
            // CompositeDeepScanLine::setMaximumSampleCount();
            // Header::setMaxImageSize();
            // Header::setMaxTileSize();

            reduceMemory = true;
        }
        else if (!strcmp (argv[i], "-t")) { reduceTime = true; }
        else if (!strcmp (argv[i], "-s")) { useStream = true; }
        else if (!strcmp (argv[i], "-c")) { enableCoreCheck = true; }
        else if (!strcmp (argv[i], "--version"))
        {
            const char* libraryVersion = getLibraryVersion ();

            cout << "exrcheck (OpenEXR) " << OPENEXR_VERSION_STRING;
            if (strcmp (libraryVersion, OPENEXR_VERSION_STRING))
                cout << "(OpenEXR version " << libraryVersion << ")";
            cout << " https://openexr.com" << endl;
            cout << "Copyright (c) Contributors to the OpenEXR Project" << endl;
            cout << "License BSD-3-Clause" << endl;

            return 0;
        }
        else
        {

#if defined _WIN32 || defined _WIN64
            if (_access (argv[i], 4) != 0)
#else
            if (access (argv[i], R_OK) != 0)
#endif
            {
                cerr << "No such file: " << argv[i] << endl;
                return -1;
            }

            cout << " file " << argv[i] << ' ';
            cout.flush ();

            bool hasError = exrCheck (
                argv[i], reduceMemory, reduceTime, useStream, enableCoreCheck);
            if (hasError)
            {
                cout << "bad\n";
                badFileFound = true;
            }
            else { cout << "OK\n"; }
        }
    }

    return badFileFound;
}